

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvkgen.cpp
# Opt level: O2

void __thiscall VkSpecParser::parseFeature(VkSpecParser *this)

{
  Data *pDVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  bool bVar4;
  char cVar5;
  bool bVar6;
  iterator iVar7;
  iterator iVar8;
  QXmlStreamAttribute *attr;
  long in_FS_OFFSET;
  QStringView QVar9;
  Data *local_120;
  char16_t *local_118;
  qsizetype local_110;
  Data *local_108;
  char16_t *local_100;
  qsizetype local_f8;
  undefined1 local_e0 [8];
  char16_t *pcStack_d8;
  qsizetype local_d0;
  QArrayDataPointer<char16_t> local_c8;
  QStringView local_b0;
  QStringView local_a0;
  QArrayDataPointer<QXmlStreamAttribute> local_90;
  QArrayDataPointer<char16_t> local_78;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d = (Data *)0x0;
  local_58.ptr = (char16_t *)0x0;
  local_58.size = 0;
  local_78.d = (Data *)0x0;
  local_78.ptr = (char16_t *)0x0;
  local_78.size = 0;
  QXmlStreamReader::attributes();
  iVar7 = QList<QXmlStreamAttribute>::begin((QList<QXmlStreamAttribute> *)&local_90);
  iVar8 = QList<QXmlStreamAttribute>::end((QList<QXmlStreamAttribute> *)&local_90);
  local_f8 = 0;
  local_100 = (char16_t *)0x0;
  local_108 = (Data *)0x0;
  local_110 = 0;
  local_118 = (char16_t *)0x0;
  local_120 = (Data *)0x0;
  while( true ) {
    if (iVar7.i == iVar8.i) break;
    local_a0.m_data = ((iVar7.i)->m_name).m_string.ptr;
    local_a0.m_size = ((iVar7.i)->m_name).m_string.size;
    local_c8.d = (Data *)0x0;
    local_e0 = (undefined1  [8])0x0;
    pcStack_d8 = (char16_t *)0x0;
    local_d0 = 0;
    local_c8.ptr = L"api";
    local_c8.size = 3;
    local_b0.m_size = 3;
    local_b0.m_data = L"api";
    bVar4 = comparesEqual(&local_a0,&local_b0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_e0);
    if (bVar4) {
      local_a0.m_data = ((iVar7.i)->m_value).m_string.ptr;
      local_a0.m_size = ((iVar7.i)->m_value).m_string.size;
      QStringView::toString((QString *)local_e0,&local_a0);
      QString::trimmed_helper((QString *)&local_c8);
      qVar3 = local_c8.size;
      pcVar2 = local_c8.ptr;
      pDVar1 = local_c8.d;
      local_58.d = local_c8.d;
      local_c8.d = local_108;
      local_58.ptr = local_c8.ptr;
      local_c8.ptr = local_100;
      local_58.size = local_c8.size;
      local_c8.size = local_f8;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_e0);
      local_f8 = qVar3;
      local_100 = pcVar2;
      local_108 = pDVar1;
    }
    else {
      local_a0.m_data = ((iVar7.i)->m_name).m_string.ptr;
      local_a0.m_size = ((iVar7.i)->m_name).m_string.size;
      local_c8.d = (Data *)0x0;
      local_e0 = (undefined1  [8])0x0;
      pcStack_d8 = (char16_t *)0x0;
      local_d0 = 0;
      local_c8.ptr = L"name";
      local_c8.size = 4;
      local_b0.m_size = 4;
      local_b0.m_data = L"name";
      bVar4 = comparesEqual(&local_a0,&local_b0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_e0);
      if (bVar4) {
        local_a0.m_data = ((iVar7.i)->m_value).m_string.ptr;
        local_a0.m_size = ((iVar7.i)->m_value).m_string.size;
        QStringView::toString((QString *)local_e0,&local_a0);
        QString::trimmed_helper((QString *)&local_c8);
        qVar3 = local_c8.size;
        pcVar2 = local_c8.ptr;
        pDVar1 = local_c8.d;
        local_78.d = local_c8.d;
        local_c8.d = local_120;
        local_78.ptr = local_c8.ptr;
        local_c8.ptr = local_118;
        local_78.size = local_c8.size;
        local_c8.size = local_110;
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_e0);
        local_110 = qVar3;
        local_118 = pcVar2;
        local_120 = pDVar1;
      }
    }
    iVar7.i = iVar7.i + 1;
  }
  QArrayDataPointer<QXmlStreamAttribute>::~QArrayDataPointer(&local_90);
  QString::split(&local_90,&local_58,0x2c,0,1);
  local_c8.d = (Data *)0x0;
  local_e0 = (undefined1  [8])0x0;
  pcStack_d8 = (char16_t *)0x0;
  local_c8.ptr = L"vulkan";
  local_d0 = 0;
  local_c8.size = 6;
  bVar4 = QListSpecialMethods<QString>::contains
                    ((QListSpecialMethods<QString> *)&local_90,(QString *)&local_c8,CaseSensitive);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_e0);
  QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_90);
  while( true ) {
    cVar5 = QXmlStreamReader::atEnd();
    if (cVar5 != '\0') break;
    QXmlStreamReader::readNext();
    bVar6 = QXmlStreamReader::isEndElement(&this->m_reader);
    if (bVar6) {
      QVar9 = (QStringView)QXmlStreamReader::name();
      local_90.d = (Data *)0x0;
      local_c8.d = (Data *)0x0;
      local_c8.ptr = (char16_t *)0x0;
      local_c8.size = 0;
      local_90.ptr = (QXmlStreamAttribute *)0x10a0d8;
      local_90.size = 7;
      local_a0.m_size = 7;
      local_a0.m_data = L"feature";
      _local_e0 = QVar9;
      bVar6 = comparesEqual((QStringView *)local_e0,&local_a0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_90);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
      if (bVar6) break;
    }
    bVar6 = QXmlStreamReader::isStartElement(&this->m_reader);
    if (bVar6) {
      QVar9 = (QStringView)QXmlStreamReader::name();
      local_90.d = (Data *)0x0;
      local_c8.d = (Data *)0x0;
      local_c8.ptr = (char16_t *)0x0;
      local_c8.size = 0;
      local_90.ptr = (QXmlStreamAttribute *)0x10a108;
      local_90.size = 7;
      local_a0.m_size = 7;
      local_a0.m_data = L"require";
      _local_e0 = QVar9;
      bVar6 = comparesEqual((QStringView *)local_e0,&local_a0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_90);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
      if (bVar6 && bVar4) {
        parseFeatureRequire(this,(QString *)&local_78);
      }
    }
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void VkSpecParser::parseFeature()
{
    // <feature api="vulkan" name="VK_VERSION_1_0" number="1.0" comment="Vulkan core API interface definitions">
    //   <require comment="Device initialization">

    QString api;
    QString versionName;
    for (const QXmlStreamAttribute &attr : m_reader.attributes()) {
        if (attr.name() == QStringLiteral("api"))
            api = attr.value().toString().trimmed();
        else if (attr.name() == QStringLiteral("name"))
            versionName = attr.value().toString().trimmed();
    }
    const bool isVulkan = api.split(',').contains(QStringLiteral("vulkan"));

    while (!m_reader.atEnd()) {
        m_reader.readNext();
        if (m_reader.isEndElement() && m_reader.name() == QStringLiteral("feature"))
            return;
        if (m_reader.isStartElement() && m_reader.name() == QStringLiteral("require")) {
            if (isVulkan)
                parseFeatureRequire(versionName);
        }
    }
}